

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

TryEmplaceResult * __thiscall
QHash<QByteArray,QByteArray>::tryEmplace_impl<QByteArray_const&>
          (QHash<QByteArray,_QByteArray> *this,QByteArray *key)

{
  piter it;
  iterator it_00;
  bool bVar1;
  bool bVar2;
  size_t bucket_00;
  Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *in_RSI;
  TryEmplaceResult *in_RDI;
  long in_FS_OFFSET;
  Node *n;
  size_t bucketIndex;
  bool resized;
  bool shouldInsert;
  size_t hash;
  Bucket bucket;
  QHash<QByteArray,_QByteArray> detachGuard;
  Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  TryEmplaceResult *this_00;
  undefined1 in_stack_ffffffffffffff80 [16];
  Bucket local_30;
  Bucket local_20;
  QHash<QByteArray,_QByteArray> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if (*(long *)in_RSI == 0) {
    QHash<QByteArray,_QByteArray>::detach
              ((QHash<QByteArray,_QByteArray> *)
               CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  }
  local_10.d = (Data *)0xaaaaaaaaaaaaaaaa;
  QHash<QByteArray,_QByteArray>::QHash(&local_10);
  QHashPrivate::calculateHash<QByteArray>
            ((QByteArray *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             (size_t)in_stack_ffffffffffffff58);
  local_20.index = 0xaaaaaaaaaaaaaaaa;
  local_20.span = (Span *)0xaaaaaaaaaaaaaaaa;
  local_20 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::
             findBucketWithHash<QByteArray>
                       (in_stack_ffffffffffffff80._8_8_,in_stack_ffffffffffffff80._0_8_,
                        (size_t)in_RSI);
  bVar1 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::Bucket::isUnused
                    ((Bucket *)0x213476);
  bVar2 = QHash<QByteArray,_QByteArray>::isDetached
                    ((QHash<QByteArray,_QByteArray> *)
                     CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  if ((!bVar2) ||
     ((bVar1 && (bVar2 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::shouldGrow
                                   (*(Data<QHashPrivate::Node<QByteArray,_QByteArray>_> **)in_RSI),
                bVar2)))) {
    QHash<QByteArray,_QByteArray>::operator=
              ((QHash<QByteArray,_QByteArray> *)this_00,(QHash<QByteArray,_QByteArray> *)in_RDI);
    bVar2 = false;
    if (bVar1) {
      bVar2 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::shouldGrow
                        (*(Data<QHashPrivate::Node<QByteArray,_QByteArray>_> **)in_RSI);
    }
    in_stack_ffffffffffffff67 = bVar2;
    bucket_00 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::Bucket::
                toBucketIndex(&local_20,
                              *(Data<QHashPrivate::Node<QByteArray,_QByteArray>_> **)in_RSI);
    if (bVar2 == false) {
      in_stack_ffffffffffffff58 =
           QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::detached(in_RSI);
    }
    else {
      in_stack_ffffffffffffff58 =
           QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::detached
                     (in_RSI,(size_t)this_00);
    }
    *(Data<QHashPrivate::Node<QByteArray,_QByteArray>_> **)in_RSI = in_stack_ffffffffffffff58;
    if (bVar2 == false) {
      QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::Bucket::Bucket
                (&local_30,*(Data<QHashPrivate::Node<QByteArray,_QByteArray>_> **)in_RSI,bucket_00);
    }
    else {
      local_30 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::
                 findBucketWithHash<QByteArray>
                           (in_stack_ffffffffffffff80._8_8_,in_stack_ffffffffffffff80._0_8_,
                            (size_t)in_RSI);
    }
    local_20 = local_30;
  }
  if (bVar1) {
    QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::Bucket::insert
              ((Bucket *)0x2135b9);
    QHashPrivate::Node<QByteArray,_QByteArray>::createInPlace<>
              ((Node<QByteArray,_QByteArray> *)
               CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               (QByteArray *)in_stack_ffffffffffffff58);
    *(long *)(*(long *)in_RSI + 8) = *(long *)(*(long *)in_RSI + 8) + 1;
  }
  QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::Bucket::toIterator
            ((Bucket *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  it.d._7_1_ = in_stack_ffffffffffffff67;
  it.d._0_7_ = in_stack_ffffffffffffff60;
  it.bucket = (size_t)in_RDI;
  QHash<QByteArray,_QByteArray>::iterator::iterator((iterator *)in_stack_ffffffffffffff58,it);
  it_00.i.d._7_1_ = in_stack_ffffffffffffff67;
  it_00.i.d._0_7_ = in_stack_ffffffffffffff60;
  it_00.i.bucket = (size_t)in_RDI;
  QHash<QByteArray,_QByteArray>::TryEmplaceResult::TryEmplaceResult
            ((TryEmplaceResult *)in_stack_ffffffffffffff58,it_00,false);
  QHash<QByteArray,_QByteArray>::~QHash
            ((QHash<QByteArray,_QByteArray> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }